

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenStorage.cpp
# Opt level: O0

TCascStorage * FreeCascStorage(TCascStorage *hs)

{
  ulong local_18;
  size_t i;
  TCascStorage *hs_local;
  
  if (hs != (TCascStorage *)0x0) {
    if (hs->pEncryptionKeys != (PCASC_MAP)0x0) {
      Map_Free(hs->pEncryptionKeys);
    }
    CASC_ARRAY::Free(&hs->ExtraKeysList);
    if ((hs->pRootHandler != (TRootHandler *)0x0) && (hs->pRootHandler != (TRootHandler *)0x0)) {
      (*hs->pRootHandler->_vptr_TRootHandler[1])();
    }
    hs->pRootHandler = (TRootHandler *)0x0;
    CASC_ARRAY::Free(&hs->VfsRootList);
    if (hs->pCKeyEntryMap != (PCASC_MAP)0x0) {
      Map_Free(hs->pCKeyEntryMap);
    }
    if (hs->pEKeyEntryMap != (PCASC_MAP)0x0) {
      Map_Free(hs->pEKeyEntryMap);
    }
    if ((hs->EncodingData).pbData != (LPBYTE)0x0) {
      free((hs->EncodingData).pbData);
    }
    for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
      if (hs->DataFiles[local_18] != (TFileStream *)0x0) {
        FileStream_Close(hs->DataFiles[local_18]);
        hs->DataFiles[local_18] = (TFileStream *)0x0;
      }
    }
    for (local_18 = 0; local_18 < 0x10; local_18 = local_18 + 1) {
      if (hs->IndexFile[local_18].szFileName != (TCHAR *)0x0) {
        free(hs->IndexFile[local_18].szFileName);
      }
      if (hs->IndexFile[local_18].pbFileData != (LPBYTE)0x0) {
        free(hs->IndexFile[local_18].pbFileData);
      }
      if ((hs->IndexFile[local_18].pEKeyEntries != (PCASC_EKEY_ENTRY)0x0) &&
         ((hs->IndexFile[local_18].FreeEKeyEntries & 1U) != 0)) {
        free(hs->IndexFile[local_18].pEKeyEntries);
      }
      hs->IndexFile[local_18].pEKeyEntries = (PCASC_EKEY_ENTRY)0x0;
    }
    if (hs->szDataPath != (TCHAR *)0x0) {
      free(hs->szDataPath);
    }
    if (hs->szBuildFile != (TCHAR *)0x0) {
      free(hs->szBuildFile);
    }
    if (hs->szIndexPath != (TCHAR *)0x0) {
      free(hs->szIndexPath);
    }
    if (hs->szCdnList != (TCHAR *)0x0) {
      free(hs->szCdnList);
    }
    FreeCascBlob(&hs->CdnConfigKey);
    FreeCascBlob(&hs->CdnBuildKey);
    FreeCascBlob(&hs->ArchiveGroup);
    FreeCascBlob(&hs->ArchivesKey);
    FreeCascBlob(&hs->PatchArchivesKey);
    FreeCascBlob(&hs->PatchArchivesGroup);
    FreeCascBlob(&hs->BuildFiles);
    hs->szClassName = (char *)0x0;
    free(hs);
  }
  return (TCascStorage *)0x0;
}

Assistant:

static TCascStorage * FreeCascStorage(TCascStorage * hs)
{
    size_t i;

    if(hs != NULL)
    {
        // Free the keys array
        if(hs->pEncryptionKeys != NULL)
            Map_Free(hs->pEncryptionKeys);
        hs->ExtraKeysList.Free();

        // Free the root handler
        if(hs->pRootHandler != NULL)
            delete hs->pRootHandler;
        hs->pRootHandler = NULL;

        // Free the VFS root list
        hs->VfsRootList.Free();

        // Free the pointers to file entries
        if(hs->pCKeyEntryMap != NULL)
            Map_Free(hs->pCKeyEntryMap);
        if(hs->pEKeyEntryMap != NULL)
            Map_Free(hs->pEKeyEntryMap);
        if(hs->EncodingData.pbData != NULL)
            CASC_FREE(hs->EncodingData.pbData);

        // Close all data files
        for(i = 0; i < CASC_MAX_DATA_FILES; i++)
        {
            if(hs->DataFiles[i] != NULL)
            {
                FileStream_Close(hs->DataFiles[i]);
                hs->DataFiles[i] = NULL;
            }
        }

        // Close all key mappings
        for(i = 0; i < CASC_INDEX_COUNT; i++)
        {
            if(hs->IndexFile[i].szFileName != NULL)
                CASC_FREE(hs->IndexFile[i].szFileName);
            if(hs->IndexFile[i].pbFileData != NULL)
                CASC_FREE(hs->IndexFile[i].pbFileData);
            if(hs->IndexFile[i].pEKeyEntries && hs->IndexFile[i].FreeEKeyEntries)
                CASC_FREE(hs->IndexFile[i].pEKeyEntries);
            hs->IndexFile[i].pEKeyEntries = NULL;
        }

        // Free the file paths
        if(hs->szDataPath != NULL)
            CASC_FREE(hs->szDataPath);
        if(hs->szBuildFile != NULL)
            CASC_FREE(hs->szBuildFile);
        if(hs->szIndexPath != NULL)
            CASC_FREE(hs->szIndexPath);
        if(hs->szCdnList != NULL)
            CASC_FREE(hs->szCdnList);

        // Free the blobs
        FreeCascBlob(&hs->CdnConfigKey);
        FreeCascBlob(&hs->CdnBuildKey);
        
        FreeCascBlob(&hs->ArchiveGroup);
        FreeCascBlob(&hs->ArchivesKey);
        FreeCascBlob(&hs->PatchArchivesKey);
        FreeCascBlob(&hs->PatchArchivesGroup);
        FreeCascBlob(&hs->BuildFiles);

        // Free the storage structure
        hs->szClassName = NULL;
        CASC_FREE(hs);
    }

    return NULL;
}